

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::InterfaceVisitor::visit(InterfaceVisitor *this,Generator *generator)

{
  bool bVar1;
  StatementType SVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *this_00;
  element_type *peVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  element_type *peVar6;
  element_type *this_02;
  shared_ptr<kratos::IDefinition> *psVar7;
  undefined1 local_e0 [8];
  shared_ptr<kratos::IDefinition> def;
  InterfaceRef *ref;
  shared_ptr<kratos::InterfacePort> interface_p;
  shared_ptr<kratos::Port> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<const_kratos::InterfaceRef_*,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
  refs;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  shared_ptr<kratos::Stmt> stmt;
  uint64_t i;
  uint64_t stmt_count;
  Generator *generator_local;
  InterfaceVisitor *this_local;
  
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Generator::stmts_count(generator);
  for (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < p_Var4;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    Generator::get_stmt((Generator *)local_38,(uint32_t)generator);
    this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
    SVar2 = Stmt::type(this_00);
    if (SVar2 == InterfaceInstantiation) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_38);
      Stmt::as<kratos::InterfaceInstantiationStmt>((Stmt *)local_48);
      peVar5 = std::__shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>::
               get((__shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2> *)
                   local_48);
      (*(this->super_IRVisitor)._vptr_IRVisitor[0x1f])(this,peVar5);
      std::shared_ptr<kratos::InterfaceInstantiationStmt>::~shared_ptr
                ((shared_ptr<kratos::InterfaceInstantiationStmt> *)local_48);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_38);
  }
  std::
  set<const_kratos::InterfaceRef_*,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
  ::set((set<const_kratos::InterfaceRef_*,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
         *)&__range2);
  this_01 = Generator::get_port_names_abi_cxx11_(generator);
  __end2 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_01);
  port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_01);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&port_name), bVar1) {
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&__end2);
    Generator::get_port((Generator *)
                        &interface_p.
                         super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(string *)generator);
    peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&interface_p.
                            super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    uVar3 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x1d])();
    if ((uVar3 & 1) != 0) {
      std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &interface_p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      Var::as<kratos::InterfacePort>((Var *)&ref);
      this_02 = std::
                __shared_ptr_access<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ref);
      def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)InterfacePort::interface(this_02);
      psVar7 = InterfaceRef::definition
                         ((InterfaceRef *)
                          def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
      std::shared_ptr<kratos::IDefinition>::shared_ptr
                ((shared_ptr<kratos::IDefinition> *)local_e0,psVar7);
      update_interface_definition
                (this,(shared_ptr<kratos::IDefinition> *)local_e0,
                 (InterfaceRef *)
                 def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi,generator);
      std::shared_ptr<kratos::IDefinition>::~shared_ptr((shared_ptr<kratos::IDefinition> *)local_e0)
      ;
      std::shared_ptr<kratos::InterfacePort>::~shared_ptr((shared_ptr<kratos::InterfacePort> *)&ref)
      ;
    }
    std::shared_ptr<kratos::Port>::~shared_ptr
              ((shared_ptr<kratos::Port> *)
               &interface_p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  std::
  set<const_kratos::InterfaceRef_*,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
  ::~set((set<const_kratos::InterfaceRef_*,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
          *)&__range2);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // local variables
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::InterfaceInstantiation) {
                visit(stmt->as<InterfaceInstantiationStmt>().get());
            }
        }
        // ports as well
        std::set<const InterfaceRef*> refs;
        for (auto const& port_name : generator->get_port_names()) {
            auto p = generator->get_port(port_name);
            if (p->is_interface()) {
                auto interface_p = p->as<InterfacePort>();
                const auto* ref = interface_p->interface();
                auto def = ref->definition();
                update_interface_definition(def, ref, generator);
            }
        }
    }